

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O3

int __thiscall
FormatTypeEDSK::LoadDisk
          (FormatTypeEDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  IDisk *this_00;
  Track *pTVar6;
  MFMTrack *pMVar7;
  byte *pbVar8;
  Sector *pSVar9;
  void *__dest;
  void *__dest_00;
  ulong *puVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uchar *puVar16;
  ulong uVar17;
  byte *pbVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  Track *pTVar22;
  int iVar23;
  int *piVar24;
  uint *puVar25;
  MFMTrack **ppMVar26;
  ulong uVar27;
  Track trk;
  Track local_58;
  
  if (*(long *)buffer != 0x4445444e45545845) {
    return -1;
  }
  this_00 = (IDisk *)operator_new(0x68);
  IDisk::IDisk(this_00);
  bVar1 = buffer[0x30];
  bVar2 = buffer[0x31];
  uVar20 = (uint)bVar2;
  if (1 < bVar2) {
    uVar20 = 2;
  }
  this_00->nb_sides_ = (byte)uVar20;
  if (bVar2 != 0) {
    uVar27 = (ulong)((uint)bVar1 * 8) * 5;
    uVar4 = 0x2a;
    if (0x2a < bVar1) {
      uVar4 = (uint)bVar1;
    }
    uVar14 = 2;
    if (bVar2 < 2) {
      uVar14 = (uint)bVar2;
    }
    pbVar18 = buffer + 0x34;
    uVar15 = 0;
    do {
      this->side_[uVar15].nb_tracks = bVar1;
      this_00->side_[uVar15].nb_tracks = (uint)bVar1;
      pTVar6 = (Track *)operator_new__(uVar27);
      this->side_[uVar15].tracks = pTVar6;
      pMVar7 = (MFMTrack *)operator_new__((ulong)(uVar4 << 5));
      this_00->side_[uVar15].tracks = pMVar7;
      memset(pMVar7,0,(ulong)bVar1 << 5);
      memset(pTVar6,0,uVar27);
      if (bVar1 != 0) {
        lVar12 = 0;
        pbVar8 = pbVar18;
        do {
          *(uint *)((long)&pTVar6->track_size + lVar12) = (uint)*pbVar8 << 8;
          lVar12 = lVar12 + 0x28;
          pbVar8 = pbVar8 + uVar14;
        } while ((ulong)((uint)bVar1 * 8) * 5 != lVar12);
      }
      uVar15 = uVar15 + 1;
      pbVar18 = pbVar18 + 1;
    } while (uVar15 != (byte)uVar20);
  }
  if (bVar1 == 0) {
    uVar15 = 0x100;
    uVar27 = (ulong)uVar20;
LAB_0015b6ea:
    uVar17 = (ulong)((int)uVar15 + 0xf);
    if ((uVar17 < size) &&
       (*(long *)(buffer + uVar15 + 6) == 0xa0d6f666e492d &&
        *(long *)(buffer + uVar15) == 0x492d74657366664f)) {
      this->extended_offset_ = true;
      if ((char)uVar27 == '\0') goto LAB_0015b9bf;
      uVar15 = 0;
      do {
        if (bVar1 != 0) {
          pTVar6 = this->side_[uVar15].tracks;
          uVar13 = 0;
          do {
            uVar19 = (ulong)pTVar6[uVar13].nb_sector;
            uVar17 = (ulong)((int)uVar17 + 2);
            if (uVar19 != 0) {
              pSVar9 = pTVar6[uVar13].sectors;
              lVar12 = 0;
              do {
                *(undefined2 *)(pSVar9->mfm_chrn + lVar12 + -0x10) =
                     *(undefined2 *)(buffer + uVar17);
                uVar17 = (ulong)((int)uVar17 + 2);
                lVar12 = lVar12 + 0x1d0;
              } while (uVar19 * 0x1d0 - lVar12 != 0);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != bVar1);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar27);
    }
  }
  else {
    uVar13 = 0;
    uVar17 = (ulong)uVar20;
    uVar15 = 0x100;
    uVar27 = uVar17;
    do {
      if ((char)uVar17 == '\0') {
        uVar17 = 0;
      }
      else {
        uVar19 = 0;
        uVar17 = uVar27;
        do {
          pTVar22 = this->side_[uVar19].tracks;
          pTVar6 = pTVar22 + uVar13;
          if (pTVar6->track_size < 0x101) {
            uVar20 = (int)uVar15 + pTVar6->track_size;
            pTVar6->formatted = false;
          }
          else {
            pTVar6->formatted = true;
            if (*(short *)(buffer + uVar15 + 8) != 0x6f66 ||
                *(long *)(buffer + uVar15) != 0x6e492d6b63617254) {
              (*this_00->_vptr_IDisk[1])(this_00);
              return -2;
            }
            puVar16 = buffer + uVar15;
            bVar2 = puVar16[0x14];
            uVar20 = (int)uVar15 + 0x100;
            pTVar22[uVar13].sz = bVar2;
            pTVar22[uVar13].sector_size = 0x80 << (bVar2 & 0x1f);
            bVar2 = puVar16[0x15];
            pTVar22[uVar13].nb_sector = (uint)bVar2;
            pTVar22[uVar13].gap3 = puVar16[0x16];
            pTVar22[uVar13].gap3_filler = 'N';
            pSVar9 = (Sector *)operator_new__((ulong)bVar2 * 0x1d0);
            pTVar22[uVar13].sectors = pSVar9;
            if (pTVar22[uVar13].nb_sector == 0) {
              piVar24 = &pTVar22[uVar13].track_size;
              uVar4 = *piVar24 - 0x100;
              iVar5 = 0x100;
LAB_0015b5b5:
              __dest = operator_new__((ulong)uVar4);
              memcpy(__dest,buffer + uVar20,(ulong)(uint)(*piVar24 - iVar5));
              iVar5 = *piVar24 - iVar5;
            }
            else {
              iVar5 = 0x100;
              iVar23 = 0x18;
              lVar12 = 0;
              uVar27 = 0;
              uVar14 = 0;
              iVar21 = 0;
              do {
                memset(pSVar9->mfm_chrn + lVar12 + -0x18,0,0x1d0);
                if (0x100U - iVar23 < iVar21 * 8 + 8U) {
                  puVar16 = buffer + uVar20;
                  uVar20 = uVar20 + 0x100;
                  iVar5 = iVar5 + 0x100;
                  iVar23 = 0;
                  iVar21 = 0;
                }
                pTVar22 = this->side_[uVar19].tracks;
                pSVar9 = pTVar22[uVar13].sectors;
                pSVar9->mfm_chrn[lVar12 + -0x18] = puVar16[(uint)(iVar23 + iVar21 * 8)];
                pSVar9->mfm_chrn[lVar12 + -0x17] = puVar16[(uint)(iVar23 + 1 + iVar21 * 8)];
                pSVar9->mfm_chrn[lVar12 + -0x16] = puVar16[(uint)(iVar23 + 2 + iVar21 * 8)];
                pSVar9->mfm_chrn[lVar12 + -0x15] = puVar16[(uint)(iVar23 + 3 + iVar21 * 8)];
                pSVar9->mfm_chrn[lVar12 + -0x14] = puVar16[(uint)(iVar23 + 4 + iVar21 * 8)];
                pSVar9->mfm_chrn[lVar12 + -0x13] = puVar16[(uint)(iVar23 + 5 + iVar21 * 8)];
                bVar2 = puVar16[(uint)(iVar23 + 6 + iVar21 * 8)];
                *(ushort *)(pSVar9->mfm_chrn + lVar12 + -0x12) = (ushort)bVar2;
                uVar3 = CONCAT11(puVar16[iVar23 + iVar21 * 8 + 7],bVar2);
                *(ushort *)(pSVar9->mfm_chrn + lVar12 + -0x12) = uVar3;
                uVar14 = uVar14 + uVar3;
                iVar21 = iVar21 + 1;
                uVar27 = uVar27 + 1;
                lVar12 = lVar12 + 0x1d0;
              } while (uVar27 < pTVar22[uVar13].nb_sector);
              piVar24 = &pTVar22[uVar13].track_size;
              uVar4 = *piVar24 - iVar5;
              if ((uVar14 < 0xff01) || (uVar14 <= uVar4)) goto LAB_0015b5b5;
              uVar4 = uVar14 + 0xff & 0xffffff00;
              *piVar24 = uVar4;
              __dest = operator_new__((long)(int)uVar4);
              memcpy(__dest,buffer + uVar20,(long)*piVar24);
              iVar5 = *piVar24;
            }
            uVar4 = pTVar22[uVar13].nb_sector;
            if (uVar4 != 0) {
              puVar25 = &pTVar22[uVar13].nb_sector;
              pSVar9 = *(Sector **)(puVar25 + 3);
              uVar15 = 0;
              lVar12 = 6;
              uVar27 = 0;
              do {
                if ((ulong)*(ushort *)(pSVar9->mfm_chrn + lVar12 + -0x18) == 0) {
                  puVar16 = pSVar9->mfm_chrn + lVar12 + -0xe;
                  puVar16[0] = '\0';
                  puVar16[1] = '\0';
                  puVar16[2] = '\0';
                  puVar16[3] = '\0';
                  puVar16[4] = '\0';
                  puVar16[5] = '\0';
                  puVar16[6] = '\0';
                  puVar16[7] = '\0';
                }
                else {
                  __dest_00 = operator_new__((ulong)*(ushort *)(pSVar9->mfm_chrn + lVar12 + -0x18));
                  pSVar9 = *(Sector **)(puVar25 + 3);
                  *(void **)(pSVar9->mfm_chrn + lVar12 + -0xe) = __dest_00;
                  memcpy(__dest_00,(void *)(uVar27 + (long)__dest),
                         (ulong)*(ushort *)(pSVar9->mfm_chrn + lVar12 + -0x18));
                  pSVar9 = *(Sector **)(puVar25 + 3);
                  uVar27 = (ulong)((int)uVar27 +
                                  (uint)*(ushort *)(pSVar9->mfm_chrn + lVar12 + -0x18));
                  uVar4 = *puVar25;
                }
                uVar15 = uVar15 + 1;
                lVar12 = lVar12 + 0x1d0;
              } while (uVar15 < uVar4);
            }
            uVar20 = uVar20 + iVar5;
            operator_delete__(__dest);
            uVar17 = (ulong)this_00->nb_sides_;
          }
          uVar15 = (ulong)uVar20;
          uVar19 = uVar19 + 1;
          uVar27 = uVar17;
        } while (uVar19 < uVar17);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != bVar1);
    if ((int)uVar15 != 0) goto LAB_0015b6ea;
  }
  if ((char)uVar27 != '\0') {
    uVar15 = 0;
    do {
      if (this_00->side_[uVar15].nb_tracks != 0) {
        ppMVar26 = &this_00->side_[uVar15].tracks;
        uVar27 = 0;
        do {
          iVar21 = (int)uVar15;
          iVar5 = (int)uVar27;
          uVar20 = GetNbRevolutions(this,iVar21,iVar5);
          pMVar7 = *ppMVar26;
          puVar25 = &pMVar7[uVar27].nb_revolutions;
          *puVar25 = uVar20;
          uVar17 = (ulong)uVar20;
          puVar10 = (ulong *)operator_new__(uVar17 * 0x30 + 8);
          *puVar10 = uVar17;
          lVar12 = 0;
          do {
            puVar11 = (undefined8 *)((long)puVar10 + lVar12 + 0x18);
            *puVar11 = 0;
            puVar11[1] = 0;
            *(undefined8 *)((long)puVar10 + lVar12 + 0x28) = 0;
            lVar12 = lVar12 + 0x30;
          } while (uVar17 * 0x30 != lVar12);
          pMVar7[uVar27].revolution = (Revolution *)(puVar10 + 1);
          if (*puVar25 != 0) {
            uVar20 = 0;
            do {
              FillTrackMfm(this,this_00,iVar21,iVar5,uVar20);
              local_58.list_sector_.
              super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_58.list_sector_.
              super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_58.list_sector_.
              super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              IDisk::GetTrackInfoForRev(this_00,iVar21,iVar5,&local_58,0);
              if (local_58.list_sector_.
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_58.list_sector_.
                                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_58.list_sector_.
                                      super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_58.list_sector_.
                                      super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < (*ppMVar26)[uVar27].nb_revolutions);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < *(uint *)(ppMVar26 + 1));
        uVar27 = (ulong)this_00->nb_sides_;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar27);
    if ((char)uVar27 != '\0') {
      uVar15 = 0;
      do {
        uVar20 = this_00->side_[uVar15].nb_tracks;
        uVar17 = (ulong)uVar20;
        if (uVar17 < 0x2a) {
          ppMVar26 = &this_00->side_[uVar15].tracks;
          pMVar7 = *ppMVar26 + uVar17;
          do {
            uVar17 = uVar17 + 1;
            pMVar7->nb_revolutions = 1;
            puVar11 = (undefined8 *)operator_new__(0x38);
            *puVar11 = 1;
            puVar11[3] = 0;
            puVar11[4] = 0;
            puVar11[5] = 0;
            pMVar7->revolution = (Revolution *)(puVar11 + 1);
            *(undefined4 *)(puVar11 + 2) = 0x40000;
            puVar16 = (uchar *)operator_new__(0x40000);
            pMVar7->revolution->bitfield = puVar16;
            memset(puVar16,0,0x40000);
            pMVar7 = pMVar7 + 1;
          } while ((int)uVar17 != 0x2a);
          if (uVar20 < 0x2a) {
            *(uint *)(ppMVar26 + 1) = 0x2a;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar27);
    }
  }
LAB_0015b9bf:
  (*this_00->_vptr_IDisk[0x14])(this_00);
  *created_disk = this_00;
  return 0;
}

Assistant:

int FormatTypeEDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                             ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "EXTENDED", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Extended
      // Name of creator : don't read
      // Number of tracks, and sides
      int m_NbTracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! - TODO
         new_disk->nb_sides_ = 2;
      }

      // Track size table
      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         unsigned int offset = 0x34 + i;
         side_[i].nb_tracks = m_NbTracks;
         new_disk->side_[i].nb_tracks = m_NbTracks;
         side_[i].tracks = new Track[m_NbTracks];
         new_disk->side_[i].tracks = new IDisk::MFMTrack[m_NbTracks < 42 ? 42 : m_NbTracks];
         memset(new_disk->side_[i].tracks, 0, (sizeof(IDisk::MFMTrack)) * m_NbTracks);
         memset(side_[i].tracks, 0, (sizeof(Track)) * m_NbTracks);
         for (j = 0; j < m_NbTracks; j++)
         {
            side_[i].tracks[j].track_size = (buffer[offset] << 8);
            //m_Side [i].Tracks[j].Formatted = ( header[offset] != 0);
            offset += new_disk->nb_sides_;
         }
      }
      unsigned int index_header = 0x100;

      for (j = 0; j < m_NbTracks; j++)
      {
         for (i = 0; i < new_disk->nb_sides_; i++)
         {
            // Formatted ?
            const unsigned char* header = buffer;

            if (side_[i].tracks[j].track_size > 0x100)
            {
               side_[i].tracks[j].formatted = true;

               header = &buffer[index_header];
               index_header += 0x100;
               //fread(header, 0x100, 1, file);

               if (memcmp(header, "Track-Info", 10) != 0)
               {
                  delete new_disk;
                  new_disk = nullptr;
                  return -2;
               }

               unsigned int size_to_remove_for_sector = 0x100;
               unsigned int offset_from_start = 0x18;
               //unsigned char* track_block = new unsigned char [m_Side[i].Tracks [j].TrackSize];
               //fread ( track_block, m_Side[i].Tracks [j].TrackSize-0x100, 1, file );
               // Track number
               unsigned int tn = header[0x10];
               if (tn != j)
               {
                  // bug...
                  //tn = m_NbTracks-1;
                  tn = j;
               }
               // Side number
               //i = header[0x11]; - Check this !
               if (i != header[0x11])
               {
               }
               unsigned char sectorSize_L = side_[i].tracks[tn].sz = header[0x14];
               side_[i].tracks[tn].sector_size = (0x80 << sectorSize_L);
               // Number of sector
               side_[i].tracks[tn].nb_sector = header[0x15];
               side_[i].tracks[tn].gap3 = header[0x16];
               side_[i].tracks[tn].gap3_filler = 0x4E; // header [0x17];
               side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
               // Sector info
               unsigned int count = 0;
               unsigned int offset = 0;
               unsigned int total_size = 0;

               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  memset(&side_[i].tracks[tn].sectors[k], 0x00, sizeof(Sector));

                  // Get next 0x100 bytes ?
                  if ((count + 1) * 8 > 0x100 - offset_from_start)
                  {
                     // Get next 0x100 bytes
                     //memcpy ( &header[0x18], track_block, 0x100-0x18 );
                     //fread(header, 0x100, 1, file);
                     header = &buffer[index_header];
                     index_header += 0x100;

                     size_to_remove_for_sector += 0x100;
                     offset_from_start = 0;
                     count = 0;
                  }
                  side_[i].tracks[tn].sectors[k].track = header[offset_from_start + count * 8 + 00];
                  side_[i].tracks[tn].sectors[k].side = header[offset_from_start + count * 8 + 01];
                  side_[i].tracks[tn].sectors[k].sector_id = header[offset_from_start + count * 8 + 02];
                  side_[i].tracks[tn].sectors[k].sector_size = header[offset_from_start + count * 8 + 03];
                  side_[i].tracks[tn].sectors[k].fdc_status_1 = header[offset_from_start + count * 8 + 04];
                  side_[i].tracks[tn].sectors[k].fdc_status_2 = header[offset_from_start + count * 8 + 05];
                  side_[i].tracks[tn].sectors[k].actual_size = header[offset_from_start + count * 8 + 06];
                  side_[i].tracks[tn].sectors[k].actual_size += header[offset_from_start + count * 8 + 07] * 256;
                  total_size += side_[i].tracks[tn].sectors[k].actual_size;
                  count++;
               }

               unsigned char* track_block = NULL;

               if (total_size > side_[i].tracks[j].track_size - size_to_remove_for_sector && total_size > 0xFF00)
               {
                  // "total_size" should be at last a multiple of 0x100
                  if ((total_size & 0xFF) != 0)
                  {
                     total_size += (0x100 - (total_size & 0xFF));
                  }
                  // Set the totalsize as a
                  side_[i].tracks[j].track_size = total_size;
                  track_block = new unsigned char[side_[i].tracks[j].track_size];
                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size);
                  index_header += side_[i].tracks[j].track_size;
               }
               else
               {
                  track_block = new unsigned char[side_[i].tracks[j].track_size - size_to_remove_for_sector];

                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size - size_to_remove_for_sector);
                  index_header += (side_[i].tracks[j].track_size - size_to_remove_for_sector);
               }

               // Data
               if (tn == 0x13)
               {
                  int dbg = 1;
               }
               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  if (side_[i].tracks[tn].sectors[k].actual_size == 0)
                  {
                     side_[i].tracks[tn].sectors[k].data = NULL;
                  }
                  else
                  {
                     side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sectors[k].actual_size
                     ];
                     memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset],
                            side_[i].tracks[tn].sectors[k].actual_size);
                     offset += side_[i].tracks[tn].sectors[k].actual_size;
                  }
               }
               delete[]track_block;
            }
            else
            {
               header = &buffer[index_header];
               index_header += side_[i].tracks[j].track_size;
               side_[i].tracks[j].formatted = false;
            }
         }
      }

      // Extension ? Offset-Info ?
      if (index_header > 0 && index_header + 0x0F < size)
      {
         unsigned char sector_index_buffer[2];
         //if (memcmp(header, "Offset-Info\r\n", 0x0E) == 0)
         if (memcmp(&buffer[index_header], "Offset-Info\r\n", 0x0E) == 0)
         {
            index_header += 0x0F;
            extended_offset_ = true;
            // OFFSET EXT.
            // For each track
            for (int side = 0; side < new_disk->nb_sides_; side++)
            {
               for (i = 0; i < m_NbTracks; i++)
               {
                  // Read track length
                  //fread(sector_index_buffer, 1, 2, file);
                  memcpy(sector_index_buffer, &buffer[index_header], 2);
                  index_header += 2;
                  // For each sector
                  for (k = 0; k < side_[side].tracks[i].nb_sector; k++)
                  {
                     // Read offset
                     //fread(sector_index_buffer, 1, 2, file);
                     memcpy(sector_index_buffer, &buffer[index_header], 2);
                     index_header += 2;

                     side_[side].tracks[i].sectors[k].sector_index = sector_index_buffer[0] + (sector_index_buffer[1] << 8);
                  }
               }
            }
         }
         else
         {
            //fseek(file, -0x0F, SEEK_CUR);
         }
      }

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Fill tracks
            unsigned int nb_revolutions = GetNbRevolutions(side, track);
            //unsigned int size = FillTrack (  side, track, NULL, 1 );
            new_disk->side_[side].tracks[track].nb_revolutions = nb_revolutions;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[nb_revolutions];

            for (unsigned int rev = 0; rev < new_disk->side_[side].tracks[track].nb_revolutions; rev++)
            {
               FillTrackMfm(new_disk, side, track, rev);

               IDisk::Track trk;
               LOG("TRACK ");
               LOG(i);
               LOGEOL
               new_disk->GetTrackInfoForRev(side, track, &trk);
               LOGEOL
            }
         }
      }

      // Complete to 42 tracks
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
         {
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
            new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
         }
         if (new_disk->side_[side].nb_tracks < 42)
            new_disk->side_[side].nb_tracks = 42;
      }

      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}